

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_graph_get_parent(ggml_cgraph *cgraph,ggml_tensor *node)

{
  ggml_tensor **ppgVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)cgraph->n_nodes;
  if (cgraph->n_nodes < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar2 == uVar3) {
      return (ggml_tensor *)0x0;
    }
    ppgVar1 = cgraph->nodes + uVar3;
    uVar3 = uVar3 + 1;
  } while ((*ppgVar1)->grad != node);
  return *ppgVar1;
}

Assistant:

static struct ggml_tensor * ggml_graph_get_parent(const struct ggml_cgraph * cgraph, const struct ggml_tensor * node) {
    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * parent = cgraph->nodes[i];

        if (parent->grad == node) {
            return parent;
        }
    }

    return NULL;
}